

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_secp256k1.cpp
# Opt level: O3

void __thiscall
Secp256k1_RangeProofInfoSecp256k1Test_Test::TestBody
          (Secp256k1_RangeProofInfoSecp256k1Test_Test *this)

{
  pointer paVar1;
  bool bVar2;
  secp256k1_context_struct *context;
  pointer range_proof;
  char *pcVar3;
  AssertionResult gtest_ar;
  int mantissa;
  int exponent;
  uint64_t max_value;
  uint64_t min_value;
  Secp256k1 secp;
  AssertHelper local_70;
  internal local_68;
  undefined7 uStack_67;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  AssertHelper local_58;
  int local_50;
  int local_4c;
  uint64_t local_48;
  uint64_t local_40;
  Secp256k1 local_38;
  
  context = wally_get_secp_context();
  cfd::core::Secp256k1::Secp256k1(&local_38,context);
  paVar1 = range_proof_info_test_vectors.
           super__Vector_base<RangeProofInfoTestVector,_std::allocator<RangeProofInfoTestVector>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (range_proof_info_test_vectors.
      super__Vector_base<RangeProofInfoTestVector,_std::allocator<RangeProofInfoTestVector>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      range_proof_info_test_vectors.
      super__Vector_base<RangeProofInfoTestVector,_std::allocator<RangeProofInfoTestVector>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    range_proof = range_proof_info_test_vectors.
                  super__Vector_base<RangeProofInfoTestVector,_std::allocator<RangeProofInfoTestVector>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    do {
      bVar2 = testing::internal::AlwaysTrue();
      if (bVar2) {
        bVar2 = testing::internal::AlwaysTrue();
        if (bVar2) {
          cfd::core::Secp256k1::RangeProofInfoSecp256k1
                    (&local_38,&range_proof->range_proof,&local_4c,&local_50,&local_40,&local_48);
        }
      }
      else {
        testing::Message::Message((Message *)&local_68);
        testing::internal::AssertHelper::AssertHelper
                  (&local_70,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_secp256k1.cpp"
                   ,0x1a9,
                   "Expected: secp.RangeProofInfoSecp256k1(test_vector.range_proof, &exponent, &mantissa, &min_value, &max_value) doesn\'t throw an exception.\n  Actual: it throws."
                  );
        testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_68);
        testing::internal::AssertHelper::~AssertHelper(&local_70);
        if (CONCAT71(uStack_67,local_68) != 0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) && ((long *)CONCAT71(uStack_67,local_68) != (long *)0x0)) {
            (**(code **)(*(long *)CONCAT71(uStack_67,local_68) + 8))();
          }
        }
      }
      testing::internal::CmpHelperEQ<int,int>
                (&local_68,"test_vector.expect_exp","exponent",&range_proof->expect_exp,&local_4c);
      if (local_68 == (internal)0x0) {
        testing::Message::Message((Message *)&local_70);
        pcVar3 = "";
        if (local_60.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = ((local_60.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_58,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_secp256k1.cpp"
                   ,0x1aa,pcVar3);
        testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_70);
        testing::internal::AssertHelper::~AssertHelper(&local_58);
        if (local_70.data_ != (AssertHelperData *)0x0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) && (local_70.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_70.data_ + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_60,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      testing::internal::CmpHelperEQ<int,int>
                (&local_68,"test_vector.expect_mantissa","mantissa",&range_proof->expect_mantissa,
                 &local_50);
      if (local_68 == (internal)0x0) {
        testing::Message::Message((Message *)&local_70);
        pcVar3 = "";
        if (local_60.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = ((local_60.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_58,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_secp256k1.cpp"
                   ,0x1ab,pcVar3);
        testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_70);
        testing::internal::AssertHelper::~AssertHelper(&local_58);
        if (local_70.data_ != (AssertHelperData *)0x0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) && (local_70.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_70.data_ + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_60,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                (&local_68,"test_vector.expect_minv","min_value",&range_proof->expect_minv,&local_40
                );
      if (local_68 == (internal)0x0) {
        testing::Message::Message((Message *)&local_70);
        pcVar3 = "";
        if (local_60.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = ((local_60.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_58,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_secp256k1.cpp"
                   ,0x1ac,pcVar3);
        testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_70);
        testing::internal::AssertHelper::~AssertHelper(&local_58);
        if (local_70.data_ != (AssertHelperData *)0x0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) && (local_70.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_70.data_ + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_60,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                (&local_68,"test_vector.expect_maxv","max_value",&range_proof->expect_maxv,&local_48
                );
      if (local_68 == (internal)0x0) {
        testing::Message::Message((Message *)&local_70);
        pcVar3 = "";
        if (local_60.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = ((local_60.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_58,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_secp256k1.cpp"
                   ,0x1ad,pcVar3);
        testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_70);
        testing::internal::AssertHelper::~AssertHelper(&local_58);
        if (local_70.data_ != (AssertHelperData *)0x0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) && (local_70.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_70.data_ + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_60,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      range_proof = range_proof + 1;
    } while (range_proof != paVar1);
  }
  return;
}

Assistant:

TEST(Secp256k1, RangeProofInfoSecp256k1Test) {
  struct secp256k1_context_struct *ctx = wally_get_secp_context();
  Secp256k1 secp = Secp256k1(ctx);

  for (const RangeProofInfoTestVector& test_vector : range_proof_info_test_vectors) {
    int exponent;
    int mantissa;
    uint64_t min_value;
    uint64_t max_value;
    EXPECT_NO_THROW(secp.RangeProofInfoSecp256k1(test_vector.range_proof, &exponent, &mantissa, &min_value, &max_value));
    EXPECT_EQ(test_vector.expect_exp, exponent);
    EXPECT_EQ(test_vector.expect_mantissa, mantissa);
    EXPECT_EQ(test_vector.expect_minv, min_value);
    EXPECT_EQ(test_vector.expect_maxv, max_value);
  }
}